

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

void __thiscall
TTD::FileReader::FileReader
          (FileReader *this,JsTTDStreamHandle handle,TTDReadBytesFromStreamCallback pfRead,
          TTDFlushAndCloseStreamCallback pfClose)

{
  HeapAllocator *this_00;
  byte *pbVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  this->_vptr_FileReader = (_func_int **)&PTR__FileReader_014e62e0;
  this->m_hfile = handle;
  this->m_pfRead = pfRead;
  this->m_pfClose = pfClose;
  this->m_peekChar = -1;
  this->m_cursor = 0;
  this->m_buffCount = 0;
  this->m_buffer = (byte *)0x0;
  local_38 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0x200000;
  data.count = (size_t)anon_var_dwarf_420ab20;
  data.filename._0_4_ = 0x25f;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_38);
  pbVar1 = (byte *)Memory::HeapAllocator::AllocT<true>(this_00,0x200000);
  if (pbVar1 != (byte *)0x0) {
    this->m_buffer = pbVar1;
    return;
  }
  TTDAbort_unrecoverable_error("OOM in TTD");
}

Assistant:

FileReader::FileReader(JsTTDStreamHandle handle, TTDReadBytesFromStreamCallback pfRead, TTDFlushAndCloseStreamCallback pfClose)
        : m_hfile(handle), m_pfRead(pfRead), m_pfClose(pfClose), m_peekChar(-1), m_cursor(0), m_buffCount(0), m_buffer(nullptr)
    {
        this->m_buffer = TT_HEAP_ALLOC_ARRAY(byte, TTD_SERIALIZATION_BUFFER_SIZE);
    }